

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  u32 iSize;
  Wal *pWVar1;
  PagerSavepoint *pPVar2;
  ulong uVar3;
  Bitvec *pBVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  u32 *puVar8;
  long lVar9;
  
  iVar7 = pPager->nSavepoint;
  lVar9 = (long)iVar7;
  lVar6 = (long)nSavepoint;
  pPVar2 = (PagerSavepoint *)sqlite3Realloc(pPager->aSavepoint,lVar6 * 0x38);
  iVar5 = 7;
  if (pPVar2 != (PagerSavepoint *)0x0) {
    memset(pPVar2 + lVar9,0,(lVar6 - lVar9) * 0x38);
    pPager->aSavepoint = pPVar2;
    puVar8 = pPVar2[lVar9].aWalData + 3;
    for (; iVar7 = iVar7 + 1, lVar9 < lVar6; lVar9 = lVar9 + 1) {
      iSize = pPager->dbSize;
      puVar8[-6] = iSize;
      if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) ||
         (uVar3 = pPager->journalOff, (long)uVar3 < 1)) {
        uVar3 = (ulong)pPager->sectorSize;
      }
      ((PagerSavepoint *)(puVar8 + -0xc))->iOffset = uVar3;
      puVar8[-5] = pPager->nSubRec;
      pBVar4 = sqlite3BitvecCreate(iSize);
      *(Bitvec **)(puVar8 + -8) = pBVar4;
      puVar8[-4] = 1;
      if (pBVar4 == (Bitvec *)0x0) {
        return 7;
      }
      pWVar1 = pPager->pWal;
      if (pWVar1 != (Wal *)0x0) {
        puVar8[-3] = (pWVar1->hdr).mxFrame;
        puVar8[-2] = (pWVar1->hdr).aFrameCksum[0];
        puVar8[-1] = (pWVar1->hdr).aFrameCksum[1];
        *puVar8 = pWVar1->nCkpt;
      }
      pPager->nSavepoint = iVar7;
      puVar8 = puVar8 + 0xe;
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static SQLITE_NOINLINE int pagerOpenSavepoint(Pager *pPager, int nSavepoint){
  int rc = SQLITE_OK;                       /* Return code */
  int nCurrent = pPager->nSavepoint;        /* Current number of savepoints */
  int ii;                                   /* Iterator variable */
  PagerSavepoint *aNew;                     /* New Pager.aSavepoint array */

  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  assert( nSavepoint>nCurrent && pPager->useJournal );

  /* Grow the Pager.aSavepoint array using realloc(). Return SQLITE_NOMEM
  ** if the allocation fails. Otherwise, zero the new portion in case a
  ** malloc failure occurs while populating it in the for(...) loop below.
  */
  aNew = (PagerSavepoint *)sqlite3Realloc(
      pPager->aSavepoint, sizeof(PagerSavepoint)*nSavepoint
  );
  if( !aNew ){
    return SQLITE_NOMEM_BKPT;
  }
  memset(&aNew[nCurrent], 0, (nSavepoint-nCurrent) * sizeof(PagerSavepoint));
  pPager->aSavepoint = aNew;

  /* Populate the PagerSavepoint structures just allocated. */
  for(ii=nCurrent; ii<nSavepoint; ii++){
    aNew[ii].nOrig = pPager->dbSize;
    if( isOpen(pPager->jfd) && pPager->journalOff>0 ){
      aNew[ii].iOffset = pPager->journalOff;
    }else{
      aNew[ii].iOffset = JOURNAL_HDR_SZ(pPager);
    }
    aNew[ii].iSubRec = pPager->nSubRec;
    aNew[ii].pInSavepoint = sqlite3BitvecCreate(pPager->dbSize);
    aNew[ii].bTruncateOnRelease = 1;
    if( !aNew[ii].pInSavepoint ){
      return SQLITE_NOMEM_BKPT;
    }
    if( pagerUseWal(pPager) ){
      sqlite3WalSavepoint(pPager->pWal, aNew[ii].aWalData);
    }
    pPager->nSavepoint = ii+1;
  }
  assert( pPager->nSavepoint==nSavepoint );
  assertTruncateConstraint(pPager);
  return rc;
}